

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O2

void __thiscall
banksia::ChessBoard::gen_addPawnMove
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          int from,int dest,bool captureOnly)

{
  Piece PVar1;
  Piece PVar2;
  MoveFull local_44;
  
  PVar1 = BoardCore::getPiece(&this->super_BoardCore,dest);
  PVar2 = BoardCore::getPiece(&this->super_BoardCore,from);
  if (((ulong)PVar1 >> 0x20 != 2 || !captureOnly) && PVar2.side != PVar1.side) {
    if (dest - 8U < 0x30) {
      local_44.super_Move.promotion = empty;
    }
    else {
      local_44.super_Move.promotion = queen;
      local_44.super_Move.from = from;
      local_44.super_Move.dest = dest;
      local_44.piece = PVar2;
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
      emplace_back<banksia::MoveFull>(moveList,&local_44);
      local_44.super_Move.promotion = rook;
      local_44.super_Move.from = from;
      local_44.super_Move.dest = dest;
      local_44.piece = PVar2;
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
      emplace_back<banksia::MoveFull>(moveList,&local_44);
      local_44.super_Move.promotion = bishop;
      local_44.super_Move.from = from;
      local_44.super_Move.dest = dest;
      local_44.piece = PVar2;
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
      emplace_back<banksia::MoveFull>(moveList,&local_44);
      local_44.super_Move.promotion = knight;
    }
    local_44.super_Move.from = from;
    local_44.super_Move.dest = dest;
    local_44.piece = PVar2;
    std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::
    emplace_back<banksia::MoveFull>(moveList,&local_44);
  }
  return;
}

Assistant:

void ChessBoard::gen_addPawnMove(std::vector<MoveFull>& moveList, int from, int dest, bool captureOnly) const
{
    auto toSide = getPiece(dest).side;
    auto movingPiece = getPiece(from);
    auto fromSide = movingPiece.side;
    
    assert(movingPiece.type == PieceType::pawn);
    if (fromSide != toSide && (!captureOnly || toSide != Side::none)) {
        if (dest >= 8 && dest < 56) {
            moveList.push_back(MoveFull(movingPiece, from, dest));
        } else {
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::queen));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::rook));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::bishop));
            moveList.push_back(MoveFull(movingPiece, from, dest, PieceType::knight));
        }
    }
}